

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O1

CURLcode Curl_doh_is_resolved(Curl_easy *data,Curl_dns_entry **dnsp)

{
  dynbuf *s;
  undefined1 *puVar1;
  DNStype DVar2;
  int iVar3;
  curl_trc_feat *pcVar4;
  undefined8 uVar5;
  ulong uVar6;
  DOHcode DVar7;
  int iVar8;
  CURLcode CVar9;
  uchar *doh;
  dohentry *pdVar10;
  size_t sVar11;
  dohentry *pdVar12;
  Curl_dns_entry *entry;
  char *pcVar13;
  uint uVar14;
  uint uVar15;
  char *pcVar16;
  long lVar17;
  doh_probes *pdVar18;
  CURLcode CVar19;
  long lVar20;
  char *pcVar21;
  void *__dest;
  uint index;
  uint uVar22;
  doh_probes *pdVar23;
  doh_probes *pdVar24;
  anon_union_16_2_f9ece763_for_ip *paVar25;
  ushort uVar26;
  uint uVar27;
  bool bVar28;
  DOHcode rc [2];
  dohentry de;
  uint local_2f8;
  CURLcode local_2f4;
  Curl_easy *local_2f0;
  undefined8 local_2e8;
  undefined8 local_2e0;
  int local_2d8;
  DOHcode local_2d4;
  doh_probes *local_2d0;
  undefined8 local_2c8;
  Curl_dns_entry **local_2c0;
  size_t local_2b8;
  char *local_2b0;
  long local_2a8;
  dohentry local_2a0;
  
  local_2d0 = (data->state).async.doh;
  *dnsp = (Curl_dns_entry *)0x0;
  if (local_2d0 == (doh_probes *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  if ((local_2d0->probe_resp[0].probe_mid == 0xffffffff) &&
     (local_2d0->probe_resp[1].probe_mid == 0xffffffff)) {
    Curl_failf(data,"Could not DoH-resolve: %s",local_2d0->host);
    return (((ulong)data->conn->bits & 0x10) == 0) + CURLE_COULDNT_RESOLVE_PROXY;
  }
  if (local_2d0->pending != 0) {
    return CURLE_OK;
  }
  local_2c0 = dnsp;
  Curl_resolv_unlink(data,&(data->state).async.dns);
  local_2c8 = 0;
  Curl_doh_close(data);
  lVar17 = 0;
  memset(&local_2a0,0,0x270);
  local_2a0.ttl = 0x7fffffff;
  do {
    pcVar21 = (char *)0x100;
    Curl_dyn_init((dynbuf *)((long)&local_2a0.cname[0].bufr + lVar17),0x100);
    lVar17 = lVar17 + 0x20;
  } while (lVar17 != 0x80);
  lVar17 = 0;
  pdVar23 = local_2d0;
  local_2f0 = data;
LAB_00125cee:
  pdVar24 = pdVar23;
  if (pdVar23->probe_resp[lVar17].dnstype != 0) {
    s = &pdVar23->probe_resp[lVar17].body;
    doh = Curl_dyn_uptr(s);
    pdVar10 = (dohentry *)Curl_dyn_len(s);
    DVar2 = pdVar23->probe_resp[lVar17].dnstype;
    local_2f8 = 0xc;
    DVar7 = DOH_TOO_SMALL_BUFFER;
    uVar14 = local_2f8;
    if (((((dohentry *)0xb < pdVar10) && (DVar7 = DOH_DNS_BAD_ID, doh != (uchar *)0x0)) &&
        (*doh == '\0')) && ((doh[1] == '\0' && (DVar7 = DOH_DNS_BAD_RCODE, (doh[3] & 0xf) == 0)))) {
      data = local_2f0;
      for (uVar26 = *(ushort *)(doh + 4) << 8 | *(ushort *)(doh + 4) >> 8; local_2f0 = data,
          uVar26 != 0; uVar26 = uVar26 - 1) {
        pcVar21 = (char *)pdVar10;
        DVar7 = doh_skipqname(doh,(size_t)pdVar10,&local_2f8);
        data = local_2f0;
        uVar14 = local_2f8;
        if (DVar7 != DOH_OK) goto LAB_0012602c;
        if (pdVar10 < (dohentry *)(ulong)(local_2f8 + 4)) {
          DVar7 = DOH_DNS_OUT_OF_RANGE;
          goto LAB_0012602c;
        }
        local_2f8 = local_2f8 + 4;
      }
      local_2e8._4_4_ = (undefined4)((ulong)local_2e8 >> 0x20);
      local_2e8 = (dohentry *)
                  CONCAT44(local_2e8._4_4_,
                           (uint)(ushort)(*(ushort *)(doh + 6) << 8 | *(ushort *)(doh + 6) >> 8));
      uVar22 = 0;
      uVar6 = (ulong)local_2e0 >> 0x20;
      local_2e0 = (dohentry *)CONCAT44((int)uVar6,DVar2);
      do {
        if ((short)local_2e8 == 0) {
          uVar26 = *(ushort *)(doh + 8) << 8 | *(ushort *)(doh + 8) >> 8;
          goto joined_r0x00125f0c;
        }
        pcVar21 = (char *)pdVar10;
        DVar7 = doh_skipqname(doh,(size_t)pdVar10,&local_2f8);
        if (DVar7 == DOH_OK) {
          uVar14 = local_2f8 + 2;
          DVar7 = DOH_DNS_OUT_OF_RANGE;
          if (pdVar10 < (dohentry *)(ulong)uVar14) goto LAB_00125df9;
          pcVar21 = (char *)((ulong)doh[local_2f8] << 8);
          uVar22 = (uint)doh[local_2f8 + 1] | (uint)pcVar21;
          if (((uVar22 == 5) || (uVar22 == 0x27)) || ((uint)local_2e0 == uVar22)) {
            pcVar21 = (char *)(ulong)(local_2f8 + 4);
            if (pdVar10 < pcVar21) goto LAB_00125ec0;
            if (CONCAT11(doh[(long)(ulong)uVar14],doh[local_2f8 + 3]) != 1) {
              DVar7 = DOH_DNS_UNEXPECTED_CLASS;
              goto LAB_00125ec0;
            }
            uVar15 = local_2f8 + 8;
            uVar14 = local_2f8 + 4;
            if (pdVar10 < (dohentry *)(ulong)uVar15) goto LAB_00125ec0;
            uVar14 = *(uint *)(doh + (long)pcVar21);
            uVar14 = uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 |
                     uVar14 << 0x18;
            pcVar21 = (char *)(ulong)uVar14;
            if (uVar14 < local_2a0.ttl) {
              local_2a0.ttl = uVar14;
            }
            index = local_2f8 + 10;
            uVar14 = uVar15;
            if (pdVar10 < (dohentry *)(ulong)index) goto LAB_00125ec0;
            uVar14 = local_2f8 + 9;
            uVar27 = index + CONCAT11(doh[(long)(ulong)uVar15],doh[uVar14]);
            local_2f8 = index;
            if (pdVar10 < (dohentry *)(ulong)uVar27) {
              bVar28 = false;
              data = local_2f0;
            }
            else {
              pcVar21 = (char *)pdVar10;
              DVar7 = doh_rdata(doh,(size_t)pdVar10,CONCAT11(doh[(long)(ulong)uVar15],doh[uVar14]),
                                (unsigned_short)uVar22,index,&local_2a0);
              bVar28 = DVar7 == DOH_OK;
              data = local_2f0;
              if (bVar28) {
                local_2e8 = (dohentry *)CONCAT44(local_2e8._4_4_,(int)local_2e8 + -1);
                DVar7 = local_2d4;
                local_2f8 = uVar27;
              }
            }
          }
          else {
            DVar7 = DOH_DNS_UNEXPECTED_TYPE;
            uVar14 = local_2f8;
LAB_00125ec0:
            local_2f8 = uVar14;
            bVar28 = false;
          }
        }
        else {
LAB_00125df9:
          bVar28 = false;
        }
        uVar14 = local_2f8;
        local_2d4 = DVar7;
      } while (bVar28);
    }
    goto LAB_0012602c;
  }
  goto LAB_001260b2;
joined_r0x00125f0c:
  if (uVar26 == 0) goto LAB_00125f7c;
  local_2e8._2_6_ = (undefined6)((ulong)local_2e8 >> 0x10);
  local_2e8 = (dohentry *)CONCAT62(local_2e8._2_6_,uVar26);
  pcVar21 = (char *)pdVar10;
  DVar7 = doh_skipqname(doh,(size_t)pdVar10,&local_2f8);
  uVar14 = local_2f8;
  if (DVar7 != DOH_OK) goto LAB_0012602c;
  pcVar21 = (char *)(ulong)(local_2f8 + 8);
  DVar7 = DOH_DNS_OUT_OF_RANGE;
  if ((pdVar10 < pcVar21) ||
     (uVar15 = local_2f8 + 10, uVar14 = local_2f8 + 8, pdVar10 < (dohentry *)(ulong)uVar15))
  goto LAB_0012602c;
  pcVar21 = (char *)((ulong)doh[(long)pcVar21] << 8);
  local_2f8 = ((uint)doh[local_2f8 + 9] | (uint)pcVar21) + uVar15;
  uVar14 = uVar15;
  if (pdVar10 < (dohentry *)(ulong)local_2f8) goto LAB_0012602c;
  uVar26 = (short)local_2e8 - 1;
  goto joined_r0x00125f0c;
LAB_00125f7c:
  uVar26 = *(ushort *)(doh + 10) << 8 | *(ushort *)(doh + 10) >> 8;
  while (uVar26 != 0) {
    local_2e8._2_6_ = (undefined6)((ulong)local_2e8 >> 0x10);
    local_2e8 = (dohentry *)CONCAT62(local_2e8._2_6_,uVar26);
    pcVar21 = (char *)pdVar10;
    DVar7 = doh_skipqname(doh,(size_t)pdVar10,&local_2f8);
    uVar14 = local_2f8;
    if (DVar7 != DOH_OK) goto LAB_0012602c;
    pcVar21 = (char *)(ulong)(local_2f8 + 8);
    DVar7 = DOH_DNS_OUT_OF_RANGE;
    if ((pdVar10 < pcVar21) ||
       (uVar15 = local_2f8 + 10, uVar14 = local_2f8 + 8, pdVar10 < (dohentry *)(ulong)uVar15))
    goto LAB_0012602c;
    pcVar21 = (char *)((ulong)doh[(long)pcVar21] << 8);
    local_2f8 = ((uint)doh[local_2f8 + 9] | (uint)pcVar21) + uVar15;
    uVar14 = uVar15;
    if (pdVar10 < (dohentry *)(ulong)local_2f8) goto LAB_0012602c;
    uVar26 = (short)local_2e8 - 1;
  }
  DVar7 = DOH_DNS_MALFORMAT;
  uVar14 = local_2f8;
  if (pdVar10 == (dohentry *)(ulong)local_2f8) {
    DVar7 = DOH_OK;
    if (local_2a0.numaddr == 0 && local_2a0.numcname == 0) {
      DVar7 = DOH_NO_CONTENT;
    }
    if ((short)uVar22 == 2) {
      DVar7 = DOH_OK;
    }
  }
LAB_0012602c:
  local_2f8 = uVar14;
  pdVar24 = local_2d0;
  *(DOHcode *)((long)&local_2c8 + lVar17 * 4) = DVar7;
  if (((data != (Curl_easy *)0x0) && (DVar7 != DOH_OK)) &&
     ((((data->set).field_0x89f & 0x40) != 0 &&
      ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))))))
  {
    pcVar16 = "bad error code";
    if (DVar7 < (DOH_DNS_BAD_ID|DOH_DNS_OUT_OF_RANGE)) {
      pcVar16 = errors_rel + *(int *)(errors_rel + (ulong)DVar7 * 4);
    }
    DVar2 = pdVar23->probe_resp[lVar17].dnstype;
    pcVar13 = "unknown";
    if (DVar2 == DNS_TYPE_AAAA) {
      pcVar13 = "AAAA";
    }
    if (DVar2 == DNS_TYPE_A) {
      pcVar13 = "A";
    }
    pcVar21 = "DoH: %s type %s for %s";
    Curl_infof(data,"DoH: %s type %s for %s",pcVar16,pcVar13,local_2d0->host);
  }
LAB_001260b2:
  pdVar18 = local_2d0;
  bVar28 = lVar17 != 0;
  lVar17 = lVar17 + 1;
  pdVar23 = pdVar24;
  if (bVar28) goto code_r0x001260c2;
  goto LAB_00125cee;
code_r0x001260c2:
  if ((int)local_2c8 != 0) {
    CVar9 = CURLE_COULDNT_RESOLVE_HOST;
    if (local_2c8._4_4_ != 0) goto LAB_001263b4;
  }
  if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
     (((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)) &&
      (0 < Curl_trc_feat_dns.log_level)))) {
    if (((pcVar4 == (curl_trc_feat *)0x0) || (0 < pcVar4->log_level)) &&
       (0 < Curl_trc_feat_dns.log_level)) {
      Curl_trc_dns(data,"hostname: %s",local_2d0->host);
    }
    pcVar21 = (char *)&local_2a0;
    doh_show(data,(dohentry *)pcVar21);
  }
  local_2b0 = pdVar18->host;
  local_2d8 = pdVar18->port;
  sVar11 = strlen(local_2b0);
  if (local_2a0.numaddr == 0) {
    CVar19 = CURLE_COULDNT_RESOLVE_HOST;
  }
  else {
    if (local_2a0.numaddr < 1) {
      local_2e0 = (dohentry *)0x0;
      local_2f4 = CURLE_OK;
    }
    else {
      local_2b8 = sVar11 + 1;
      local_2a8 = sVar11 + 0x31;
      local_2d8 = CONCAT22((short)((uint)local_2d8 >> 0x10),
                           (ushort)local_2d8 << 8 | (ushort)local_2d8 >> 8);
      lVar17 = 0;
      paVar25 = &local_2a0.addr[0].ip;
      local_2f4 = CURLE_OK;
      pdVar10 = (dohentry *)0x0;
      local_2e0 = (dohentry *)0x0;
      do {
        iVar3 = ((dohaddr *)((long)paVar25 + -4))->type;
        lVar20 = 0x1c;
        local_2d4 = CONCAT31(local_2d4._1_3_,iVar3 == 0x1c);
        if (iVar3 != 0x1c) {
          lVar20 = 0x10;
        }
        local_2e8 = pdVar10;
        pdVar12 = (dohentry *)(*Curl_ccalloc)(1,local_2a8 + lVar20);
        if (pdVar12 == (dohentry *)0x0) {
          local_2f4 = CURLE_OUT_OF_MEMORY;
          pdVar10 = local_2e8;
        }
        else {
          pdVar12->cname[1].bufr = (char *)&pdVar12->cname[1].allc;
          __dest = (void *)((long)&pdVar12->cname[1].allc + lVar20);
          pdVar12->cname[0].toobig = (size_t)__dest;
          memcpy(__dest,local_2b0,local_2b8);
          if (local_2e0 == (dohentry *)0x0) {
            local_2e0 = pdVar12;
          }
          if (local_2e8 != (dohentry *)0x0) {
            local_2e8->cname[1].leng = (size_t)pdVar12;
          }
          iVar8 = (local_2d4 & 0xff) * 8 + 2;
          *(int *)((long)&pdVar12->cname[0].bufr + 4) = iVar8;
          *(undefined4 *)&pdVar12->cname[0].leng = 1;
          *(int *)&pdVar12->cname[0].allc = (int)lVar20;
          pcVar21 = pdVar12->cname[1].bufr;
          if (iVar3 == 0x1c) {
            uVar5 = *(undefined8 *)((long)paVar25 + 8);
            *(undefined8 *)(pcVar21 + 8) = *(undefined8 *)paVar25;
            *(undefined8 *)(pcVar21 + 0x10) = uVar5;
          }
          else {
            *(undefined4 *)(pcVar21 + 4) = *(undefined4 *)paVar25;
          }
          *(short *)pcVar21 = (short)iVar8;
          *(short *)(pcVar21 + 2) = (short)local_2d8;
          pdVar10 = pdVar12;
        }
        data = local_2f0;
        if (pdVar12 == (dohentry *)0x0) break;
        lVar17 = lVar17 + 1;
        paVar25 = (anon_union_16_2_f9ece763_for_ip *)((long)paVar25 + 0x14);
      } while (lVar17 < local_2a0.numaddr);
    }
    pdVar18 = local_2d0;
    pcVar21 = (char *)local_2e0;
    CVar19 = local_2f4;
    if (local_2f4 != CURLE_OK) {
      Curl_freeaddrinfo((Curl_addrinfo *)local_2e0);
      pdVar18 = local_2d0;
      pcVar21 = (char *)(dohentry *)0x0;
      CVar19 = local_2f4;
    }
  }
  if (CVar19 == CURLE_OK) {
    entry = Curl_dnscache_mk_entry
                      (data,(Curl_addrinfo *)pcVar21,pdVar18->host,0,pdVar18->port,false);
    CVar9 = CURLE_OK;
    if (entry != (Curl_dns_entry *)0x0) {
      (data->state).async.dns = entry;
      CVar9 = Curl_dnscache_add(data,entry);
      *local_2c0 = (data->state).async.dns;
    }
  }
  else {
    CVar9 = CVar19;
    if (0 < local_2a0.numcname) {
      lVar17 = 0;
      pdVar10 = &local_2a0;
      do {
        Curl_dyn_free(pdVar10->cname);
        lVar17 = lVar17 + 1;
        pdVar10 = (dohentry *)(pdVar10->cname + 1);
      } while (lVar17 < local_2a0.numcname);
    }
  }
  if (CVar19 != CURLE_OK) {
    return CVar19;
  }
LAB_001263b4:
  puVar1 = &(data->state).async.field_0x28;
  *puVar1 = *puVar1 | 1;
  if (0 < local_2a0.numcname) {
    pdVar10 = &local_2a0;
    lVar17 = 0;
    do {
      Curl_dyn_free(pdVar10->cname);
      lVar17 = lVar17 + 1;
      pdVar10 = (dohentry *)(pdVar10->cname + 1);
    } while (lVar17 < local_2a0.numcname);
  }
  Curl_doh_cleanup(local_2f0);
  return CVar9;
}

Assistant:

CURLcode Curl_doh_is_resolved(struct Curl_easy *data,
                              struct Curl_dns_entry **dnsp)
{
  CURLcode result;
  struct doh_probes *dohp = data->state.async.doh;
  *dnsp = NULL; /* defaults to no response */
  if(!dohp)
    return CURLE_OUT_OF_MEMORY;

  if(dohp->probe_resp[DOH_SLOT_IPV4].probe_mid == UINT_MAX &&
     dohp->probe_resp[DOH_SLOT_IPV6].probe_mid == UINT_MAX) {
    failf(data, "Could not DoH-resolve: %s", dohp->host);
    return CONN_IS_PROXIED(data->conn) ? CURLE_COULDNT_RESOLVE_PROXY :
      CURLE_COULDNT_RESOLVE_HOST;
  }
  else if(!dohp->pending) {
    DOHcode rc[DOH_SLOT_COUNT];
    struct dohentry de;
    int slot;

    /* Clear any result the might still be there */
    Curl_resolv_unlink(data, &data->state.async.dns);

    memset(rc, 0, sizeof(rc));
    /* remove DoH handles from multi handle and close them */
    Curl_doh_close(data);
    /* parse the responses, create the struct and return it! */
    de_init(&de);
    for(slot = 0; slot < DOH_SLOT_COUNT; slot++) {
      struct doh_response *p = &dohp->probe_resp[slot];
      if(!p->dnstype)
        continue;
      rc[slot] = doh_resp_decode(Curl_dyn_uptr(&p->body),
                                 Curl_dyn_len(&p->body),
                                 p->dnstype, &de);
#ifndef CURL_DISABLE_VERBOSE_STRINGS
      if(rc[slot]) {
        infof(data, "DoH: %s type %s for %s", doh_strerror(rc[slot]),
              doh_type2name(p->dnstype), dohp->host);
      }
#endif
    } /* next slot */

    result = CURLE_COULDNT_RESOLVE_HOST; /* until we know better */
    if(!rc[DOH_SLOT_IPV4] || !rc[DOH_SLOT_IPV6]) {
      /* we have an address, of one kind or other */
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *ai;


      if(Curl_trc_ft_is_verbose(data, &Curl_trc_feat_dns)) {
        CURL_TRC_DNS(data, "hostname: %s", dohp->host);
        doh_show(data, &de);
      }

      result = doh2ai(&de, dohp->host, dohp->port, &ai);
      if(result) {
        de_cleanup(&de);
        return result;
      }

      /* we got a response, create a dns entry. */
      dns = Curl_dnscache_mk_entry(data, ai, dohp->host, 0, dohp->port, FALSE);
      if(dns) {
        /* Now add and HTTPSRR information if we have */
#ifdef USE_HTTPSRR
        if(de.numhttps_rrs > 0 && result == CURLE_OK) {
          struct Curl_https_rrinfo *hrr = NULL;
          result = doh_resp_decode_httpsrr(data, de.https_rrs->val,
                                           de.https_rrs->len, &hrr);
          if(result) {
            infof(data, "Failed to decode HTTPS RR");
            return result;
          }
          infof(data, "Some HTTPS RR to process");
# ifdef DEBUGBUILD
          doh_print_httpsrr(data, hrr);
# endif
          dns->hinfo = hrr;
       }
#endif
        /* and add the entry to the cache */
        data->state.async.dns = dns;
        result = Curl_dnscache_add(data, dns);
        *dnsp = data->state.async.dns;
      }
    } /* address processing done */

    /* All done */
    data->state.async.done = TRUE;
    de_cleanup(&de);
    Curl_doh_cleanup(data);
    return result;

  } /* !dohp->pending */

  /* else wait for pending DoH transactions to complete */
  return CURLE_OK;
}